

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

int __thiscall Epanet::Project::saveOutput(Project *this)

{
  if (this->outputFileOpened == true) {
    OutputFile::writeNetworkResults(&this->outputFile);
  }
  return 0;
}

Assistant:

int Project::saveOutput()
    {
        if ( !outputFileOpened ) return 0;
        try
        {
            outputFile.writeNetworkResults();
            return 0;
    	}
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }